

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>::
~DeviceObjectBase(DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>
                  *this)

{
  IMemoryAllocator *pIVar1;
  DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>
  *this_local;
  
  (this->super_ObjectBase<Diligent::IFenceGL>).super_RefCountedObject<Diligent::IFenceGL>.
  super_IFenceGL.super_IFence.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_0058f498;
  pIVar1 = GetStringAllocator();
  (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,(this->m_Desc).super_DeviceObjectAttribs.Name);
  if ((this->m_bIsDeviceInternal & 1U) == 0) {
    RenderDeviceBase<Diligent::EngineGLImplTraits>::Release
              (&this->m_pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  }
  RefCntAutoPtr<Diligent::IObject>::~RefCntAutoPtr(&this->m_pUserData);
  ObjectBase<Diligent::IFenceGL>::~ObjectBase(&this->super_ObjectBase<Diligent::IFenceGL>);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }